

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O2

void __thiscall despot::Chain::ComputeOptimalValue(Chain *this,ChainState *state)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ACT_TYPE a;
  long lVar7;
  double v;
  double dVar8;
  double dVar9;
  allocator_type local_71;
  vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> next_policy;
  vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> policy;
  
  std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::vector
            (&policy,5,(allocator_type *)&next_policy);
  for (lVar4 = 8; lVar4 != 0x58; lVar4 = lVar4 + 0x10) {
    *(undefined8 *)
     (policy.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl
      .super__Vector_impl_data._M_start + lVar4) = 0;
  }
  std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::vector
            (&next_policy,5,&local_71);
  uVar2 = Globals::NEG_INFTY;
  lVar4 = 0;
  do {
    for (; lVar4 != 5; lVar4 = lVar4 + 1) {
      lVar6 = lVar4 * 0x10;
      *(undefined4 *)
       (next_policy.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
        _M_impl.super__Vector_impl_data._M_start + lVar6) = 0xffffffff;
      *(undefined8 *)
       (next_policy.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
        _M_impl.super__Vector_impl_data._M_start + lVar6 + 8) = uVar2;
      lVar7 = 0;
      while( true ) {
        iVar3 = (**(code **)(*(long *)this + 0x28))(this);
        if (iVar3 <= lVar7) break;
        dVar8 = 0.0;
        for (lVar5 = 0; lVar5 != 0x28; lVar5 = lVar5 + 8) {
          dVar9 = 2.0;
          if ((lVar5 != 0) && (dVar9 = 10.0, lVar5 != 0x20 || lVar4 != 4)) {
            dVar9 = 0.0;
          }
          dVar8 = dVar8 + (*(double *)
                            (policy.
                             super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar5 * 2 + 8) *
                           ___cxa_finalize + dVar9) *
                          *(double *)
                           (*(long *)(*(long *)&(state->mdp_transitions_).
                                                super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start[lVar4].
                                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                ._M_impl.super__Vector_impl_data + lVar7 * 0x18) +
                           lVar5);
        }
        if (*(double *)
             (next_policy.
              super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
              _M_impl.super__Vector_impl_data._M_start + lVar6 + 8) <= dVar8 &&
            dVar8 != *(double *)
                      (next_policy.
                       super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar6 + 8)) {
          *(double *)
           (next_policy.
            super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl.
            super__Vector_impl_data._M_start + lVar6 + 8) = dVar8;
          *(int *)(next_policy.
                   super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
                   _M_impl.super__Vector_impl_data._M_start + lVar6) = (int)lVar7;
        }
        lVar7 = lVar7 + 1;
      }
    }
    dVar8 = 0.0;
    for (lVar4 = 8; lVar4 != 0x58; lVar4 = lVar4 + 0x10) {
      dVar8 = dVar8 + ABS(*(double *)
                           (next_policy.
                            super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar4) -
                          *(double *)
                           (policy.
                            super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar4));
      uVar1 = *(undefined8 *)
               (next_policy.
                super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
                _M_impl.super__Vector_impl_data._M_start + lVar4 + -8 + 8);
      *(undefined8 *)
       (policy.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
        _M_impl.super__Vector_impl_data._M_start + lVar4 + -8) =
           *(undefined8 *)
            (next_policy.
             super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl
             .super__Vector_impl_data._M_start + lVar4 + -8);
      *(undefined8 *)
       (policy.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
        _M_impl.super__Vector_impl_data._M_start + lVar4 + -8 + 8) = uVar1;
    }
    lVar4 = 0;
  } while (0.001 <= dVar8);
  std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::operator=
            (&state->policy,&policy);
  std::_Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::~_Vector_base
            (&next_policy.
              super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>);
  std::_Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::~_Vector_base
            (&policy.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
            );
  return;
}

Assistant:

void Chain::ComputeOptimalValue(ChainState& state) const {
	vector<ValuedAction> policy = vector<ValuedAction>(NUM_MDP_STATES);
	for (int s = 0; s < NUM_MDP_STATES; s++) {
		policy[s].value = 0;
	}

	vector<ValuedAction> next_policy = vector<ValuedAction>(NUM_MDP_STATES);
	int iter = 0;
	double diff;
	while (true) {
		for (int s = 0; s < NUM_MDP_STATES; s++) {
			next_policy[s].action = -1;
			next_policy[s].value = Globals::NEG_INFTY;

			for (ACT_TYPE a = 0; a < NumActions(); a++) {
				double v = 0;
				for (int nexts = 0; nexts < NUM_MDP_STATES; nexts++) {
					v += state.GetTransition(s, a, nexts)
						* (Reward(s, a, nexts)
							+ Globals::Discount() * policy[nexts].value);
				}

				if (v > next_policy[s].value) {
					next_policy[s].value = v;
					next_policy[s].action = a;
				}
			}
		}

		diff = 0;
		for (int s = 0; s < NUM_MDP_STATES; s++) {
			diff += fabs(next_policy[s].value - policy[s].value);
			policy[s] = next_policy[s];
		}

		iter++;
		if (diff < 0.001)
			break;
	}

	state.policy = policy;
}